

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-stdio-over-pipes.c
# Opt level: O0

void on_pipe_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  int iVar1;
  uv_buf_t *buf_local;
  ssize_t nread_local;
  uv_stream_t *tcp_local;
  
  if (nread < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xa7,"nread > 0");
    abort();
  }
  iVar1 = memcmp("hello world\n",buf->base,nread);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-stdio-over-pipes.c"
            ,0xa8,"memcmp(\"hello world\\n\", buf->base, nread) == 0");
    abort();
  }
  on_pipe_read_called = on_pipe_read_called + 1;
  free(buf->base);
  uv_close(&stdin_pipe,close_cb);
  uv_close(&stdout_pipe,close_cb);
  return;
}

Assistant:

static void on_pipe_read(uv_stream_t* tcp, ssize_t nread, const uv_buf_t* buf) {
  ASSERT(nread > 0);
  ASSERT(memcmp("hello world\n", buf->base, nread) == 0);
  on_pipe_read_called++;

  free(buf->base);

  uv_close((uv_handle_t*)&stdin_pipe, close_cb);
  uv_close((uv_handle_t*)&stdout_pipe, close_cb);
}